

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O0

void baryonyx::itm::improve_memory_usage
               (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *csts)

{
  bool bVar1;
  reference this;
  iterator iVar2;
  iterator iVar3;
  merged_constraint *cst;
  iterator __end2;
  iterator __begin2;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *__range2;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *csts_local;
  
  __end2 = std::
           vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           ::begin(csts);
  cst = (merged_constraint *)
        std::
        vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ::end(csts);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                      (&__end2,(__normal_iterator<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
                                *)&cst);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this = __gnu_cxx::
           __normal_iterator<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
           ::operator*(&__end2);
    iVar2 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
            begin(&this->elements);
    iVar3 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
            end(&this->elements);
    std::
    sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,baryonyx::itm::improve_memory_usage(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>&)::__0>
              (iVar2._M_current,iVar3._M_current);
    __gnu_cxx::
    __normal_iterator<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void
improve_memory_usage(std::vector<merged_constraint>& csts)
{
    for (auto& cst : csts)
        std::sort(cst.elements.begin(),
                  cst.elements.end(),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.variable_index < rhs.variable_index;
                  });
}